

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O1

bool __thiscall test_CEException::test_sofa_exception(test_CEException *this)

{
  sofa_exception *this_00;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (sofa_exception *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"test_CEException::test_sofa_exception()",&local_8a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"No method currently checked",&local_8b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"Testing throwing \'CEException::sofa_exception\'",&local_89);
  CEException::sofa_exception::sofa_exception(this_00,&local_88,&local_68,&local_48);
  __cxa_throw(this_00,&CEException::sofa_exception::typeinfo,CEExceptionHandler::~CEExceptionHandler
             );
}

Assistant:

bool test_CEException::test_sofa_exception(void)
{
    // Try throwing
    try {
        // TODO: find a sofa method that can be configured to return a bad error code
        throw CEException::sofa_exception("test_CEException::test_sofa_exception()",
                                      "No method currently checked",
                                      "Testing throwing 'CEException::sofa_exception'");
        // If we get here there's a problem
        log_failure("CEException::sofa_exception failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::sofa_exception & e) {
        // This is where we should be
        log_success("CEException::sofa_exception thrown successfully", __func__, __LINE__);
        update_pass(true);
    }

    return pass();
}